

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O2

void __thiscall
jrtplib::RTCPCompoundPacketBuilder::RTCPCompoundPacketBuilder
          (RTCPCompoundPacketBuilder *this,RTPMemoryManager *mgr)

{
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  *plVar1;
  list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
  *plVar2;
  
  RTCPCompoundPacket::RTCPCompoundPacket(&this->super_RTCPCompoundPacket,mgr);
  (this->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPCompoundPacketBuilder_00145858;
  (this->report).super_RTPMemoryObject.mgr = mgr;
  (this->report).super_RTPMemoryObject._vptr_RTPMemoryObject = (_func_int **)&PTR__Report_00145890;
  plVar1 = &(this->report).reportblocks;
  (this->report).reportblocks.
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->report).reportblocks.
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->report).reportblocks.
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ._M_impl._M_node._M_size = 0;
  (this->report).headerdata = (uint8_t *)(this->report).headerdata32;
  (this->report).isSR = false;
  (this->report).headerlength = 0;
  (this->sdes).super_RTPMemoryObject.mgr = mgr;
  (this->sdes).super_RTPMemoryObject._vptr_RTPMemoryObject = (_func_int **)&PTR__SDES_001458c8;
  plVar2 = &(this->sdes).sdessources;
  (this->sdes).sdessources.
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->sdes).sdessources.
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
  (this->sdes).sdessources.
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->sdes).sdesit._M_node = (_List_node_base *)plVar2;
  (this->byepackets).
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->byepackets;
  (this->byepackets).
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->byepackets;
  (this->byepackets).
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ._M_impl._M_node._M_size = 0;
  (this->apppackets).
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->apppackets;
  (this->apppackets).
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->apppackets;
  this->byesize = 0;
  this->maximumpacketsize = 0;
  this->buffer = (uint8_t *)0x0;
  this->external = false;
  this->arebuilding = false;
  (this->apppackets).
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ._M_impl._M_node._M_size = 0;
  this->appsize = 0;
  return;
}

Assistant:

RTCPCompoundPacketBuilder::RTCPCompoundPacketBuilder(RTPMemoryManager *mgr) : RTCPCompoundPacket(mgr), report(mgr), sdes(mgr)
{
	byesize = 0;
	appsize = 0;
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	unknownsize = 0;
#endif // RTP_SUPPORT_RTCPUNKNOWN
	maximumpacketsize = 0;
	buffer = 0;
	external = false;
	arebuilding = false;
}